

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ConstantValue::at(ConstantValue *this,size_t index)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_numeric_ConstantValue_cpp:166:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
  pCVar1;
  anon_class_8_1_a81517f2 local_20;
  size_t local_18;
  size_t index_local;
  ConstantValue *this_local;
  
  local_20.index = index;
  local_18 = index;
  index_local = (size_t)this;
  pCVar1 = std::
           visit<slang::ConstantValue::at(unsigned_long)::__0,std::variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>&>
                     (&local_20,&this->value);
  return pCVar1;
}

Assistant:

ConstantValue& ConstantValue::at(size_t index) {
    return std::visit(
        [index](auto&& arg) -> ConstantValue& {
            using T = std::decay_t<decltype(arg)>;
            if constexpr (std::is_same_v<T, Elements>)
                return arg.at(index);
            else if constexpr (std::is_same_v<T, Queue>)
                return arg->at(index);
            else
                ASSUME_UNREACHABLE;
        },
        value);
}